

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Error cff_index_access_element
                   (CFF_Index idx,FT_UInt element,FT_Byte **pbytes,FT_ULong *pbyte_len)

{
  FT_ULong *pFVar1;
  unsigned_long uVar2;
  bool bVar3;
  ulong uVar4;
  FT_ULong count;
  long lVar5;
  FT_Stream stream;
  FT_ULong unaff_R13;
  FT_Error error;
  FT_Error local_44;
  FT_Stream local_40;
  FT_Byte **local_38;
  
  local_44 = 0;
  if ((idx == (CFF_Index)0x0) || (idx->count <= element)) {
    return 6;
  }
  stream = idx->stream;
  pFVar1 = idx->offsets;
  if (pFVar1 != (FT_ULong *)0x0) {
    unaff_R13 = pFVar1[element];
    if (unaff_R13 == 0) {
      unaff_R13 = 0;
    }
    else {
      lVar5 = 0;
      do {
        uVar4 = pFVar1[(ulong)element + lVar5 + 1];
        if (uVar4 != 0) goto LAB_002270bd;
        lVar5 = lVar5 + 1;
      } while (idx->count - element != (int)lVar5);
    }
    uVar4 = 0;
    goto LAB_002270bd;
  }
  local_40 = stream;
  local_38 = pbytes;
  local_44 = FT_Stream_Seek(stream,(ulong)idx->hdr_size + idx->start +
                                   (ulong)(idx->off_size * element));
  if (local_44 == 0) {
    unaff_R13 = cff_index_read_offset(idx,&local_44);
    uVar4 = 0;
    if (local_44 != 0) goto LAB_002270ad;
    bVar3 = true;
    if (unaff_R13 != 0) {
      do {
        uVar4 = cff_index_read_offset(idx,&local_44);
        if (uVar4 != 0) goto LAB_0022719b;
        element = element + 1;
      } while (element < idx->count);
      uVar4 = 0;
LAB_0022719b:
      bVar3 = true;
    }
  }
  else {
LAB_002270ad:
    uVar4 = 0;
    bVar3 = false;
  }
  pbytes = local_38;
  stream = local_40;
  if (!bVar3) {
    return local_44;
  }
LAB_002270bd:
  uVar2 = stream->size;
  if ((uVar2 + 1 < uVar4) || ((uVar2 - uVar4) + 1 < idx->data_offset)) {
    uVar4 = (uVar2 - idx->data_offset) + 1;
  }
  if ((unaff_R13 == 0) || (count = uVar4 - unaff_R13, uVar4 < unaff_R13 || count == 0)) {
    *pbytes = (FT_Byte *)0x0;
    *pbyte_len = 0;
  }
  else {
    *pbyte_len = count;
    if (idx->bytes == (FT_Byte *)0x0) {
      local_44 = FT_Stream_Seek(stream,(idx->data_offset + unaff_R13) - 1);
      if (local_44 == 0) {
        local_44 = FT_Stream_ExtractFrame(stream,count,pbytes);
      }
    }
    else {
      *pbytes = idx->bytes + (unaff_R13 - 1);
    }
  }
  return local_44;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_index_access_element( CFF_Index  idx,
                            FT_UInt    element,
                            FT_Byte**  pbytes,
                            FT_ULong*  pbyte_len )
  {
    FT_Error  error = FT_Err_Ok;


    if ( idx && idx->count > element )
    {
      /* compute start and end offsets */
      FT_Stream  stream = idx->stream;
      FT_ULong   off1, off2 = 0;


      /* load offsets from file or the offset table */
      if ( !idx->offsets )
      {
        FT_ULong  pos = element * idx->off_size;


        if ( FT_STREAM_SEEK( idx->start + idx->hdr_size + pos ) )
          goto Exit;

        off1 = cff_index_read_offset( idx, &error );
        if ( error )
          goto Exit;

        if ( off1 != 0 )
        {
          do
          {
            element++;
            off2 = cff_index_read_offset( idx, &error );

          } while ( off2 == 0 && element < idx->count );
        }
      }
      else   /* use offsets table */
      {
        off1 = idx->offsets[element];
        if ( off1 )
        {
          do
          {
            element++;
            off2 = idx->offsets[element];

          } while ( off2 == 0 && element < idx->count );
        }
      }

      /* XXX: should check off2 does not exceed the end of this entry; */
      /*      at present, only truncate off2 at the end of this stream */
      if ( off2 > stream->size + 1                    ||
           idx->data_offset > stream->size - off2 + 1 )
      {
        FT_ERROR(( "cff_index_access_element:"
                   " offset to next entry (%ld)"
                   " exceeds the end of stream (%ld)\n",
                   off2, stream->size - idx->data_offset + 1 ));
        off2 = stream->size - idx->data_offset + 1;
      }

      /* access element */
      if ( off1 && off2 > off1 )
      {
        *pbyte_len = off2 - off1;

        if ( idx->bytes )
        {
          /* this index was completely loaded in memory, that's easy */
          *pbytes = idx->bytes + off1 - 1;
        }
        else
        {
          /* this index is still on disk/file, access it through a frame */
          if ( FT_STREAM_SEEK( idx->data_offset + off1 - 1 ) ||
               FT_FRAME_EXTRACT( off2 - off1, *pbytes )      )
            goto Exit;
        }
      }
      else
      {
        /* empty index element */
        *pbytes    = 0;
        *pbyte_len = 0;
      }
    }
    else
      error = FT_THROW( Invalid_Argument );

  Exit:
    return error;
  }